

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O2

uint16_t wirehair::GetPeelSeed(uint N)

{
  byte *pbVar1;
  
  pbVar1 = kPeelSeeds + (N & 0x7ff);
  if (N < 0x800) {
    pbVar1 = kSmallPeelSeeds + N;
  }
  return (uint16_t)*pbVar1;
}

Assistant:

uint16_t GetPeelSeed(unsigned N)
{
    if (N < (kTinyTableCount + kSmallTableCount)) {
        return kSmallPeelSeeds[N];
    }

    CAT_DEBUG_ASSERT(N >= kSmallTableCount && N <= 64000);

    const unsigned subdivision = N % kPeelSeedSubdivisions;

    // Get seed from subdivided table
    return kPeelSeeds[subdivision];
}